

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeH1.cpp
# Opt level: O0

void TPZShapeH1<pzshape::TPZShapePiram>::Shape(TPZVec<double> *pt,TPZShapeData *data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int64_t iVar5;
  double *pdVar6;
  TPZFMatrix<double> *pTVar7;
  long in_RSI;
  int xj_1;
  int i_1;
  int xj;
  int i;
  TPZFMatrix<double> *mult;
  TPZFNMatrix<1,_double> auxmat;
  int opt;
  REAL beta;
  REAL alpha;
  TPZManVector<double,_3> outvec;
  TPZFNMatrix<100,_double> dphiaux2;
  TPZFNMatrix<100,_double> dphiaux;
  TPZFNMatrix<100,_double> dphin;
  TPZFNMatrix<100,_double> phin;
  int sidedim;
  TPZTransform<double> *transform;
  int d_1;
  int numshape;
  int side;
  int shape;
  int d;
  int nod;
  TPZFNMatrix<57,_double> dphiblend;
  TPZFNMatrix<57,_double> phiblend;
  int NCorners;
  int NSides;
  int dim;
  _func_int **in_stack_ffffffffffffe978;
  TPZFMatrix<double> *in_stack_ffffffffffffe980;
  TPZFMatrix<double> *in_stack_ffffffffffffe988;
  double *in_stack_ffffffffffffe990;
  TPZVec<double> *in_stack_ffffffffffffe998;
  TPZFNMatrix<100,_double> *in_stack_ffffffffffffe9a0;
  TPZVec<double> *in_stack_ffffffffffffe9a8;
  TPZTransform<double> *in_stack_ffffffffffffe9b0;
  double *in_stack_ffffffffffffe9b8;
  TPZFNMatrix<1,_double> *in_stack_ffffffffffffe9c0;
  TPZFMatrix<double> *in_stack_ffffffffffffeaa0;
  TPZFMatrix<double> *in_stack_ffffffffffffeaa8;
  undefined4 in_stack_ffffffffffffeab0;
  undefined4 in_stack_ffffffffffffeab4;
  int local_1508;
  int local_1504;
  int local_1500;
  int local_14fc;
  undefined1 local_14e8 [164];
  undefined4 local_1444;
  undefined8 local_1440;
  undefined8 local_1438;
  TPZFMatrix<double> *in_stack_ffffffffffffed40;
  TPZFMatrix<double> *in_stack_ffffffffffffed48;
  TPZVec<double> *in_stack_ffffffffffffed50;
  undefined1 local_1040 [952];
  undefined1 local_c88 [1908];
  int local_514;
  TPZTransform<double> *local_510;
  int local_504;
  int local_500;
  int local_4fc;
  int local_4f8;
  int local_4f4;
  int local_4f0;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  long local_10;
  
  local_10 = in_RSI;
  pzshape::TPZShapePiram::ShapeCorner
            ((TPZVec<double> *)CONCAT44(in_stack_ffffffffffffeab4,in_stack_ffffffffffffeab0),
             in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
  iVar5 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(local_10 + 0x22a0));
  if (iVar5 != 5) {
    local_14 = 3;
    local_18 = 0x13;
    local_1c = 5;
    TPZFNMatrix<57,_double>::TPZFNMatrix
              ((TPZFNMatrix<57,_double> *)in_stack_ffffffffffffe9a0,
               (int64_t)in_stack_ffffffffffffe998,(int64_t)in_stack_ffffffffffffe990);
    TPZFNMatrix<57,_double>::TPZFNMatrix
              ((TPZFNMatrix<57,_double> *)in_stack_ffffffffffffe9a0,
               (int64_t)in_stack_ffffffffffffe998,(int64_t)in_stack_ffffffffffffe990);
    for (local_4f0 = 0; local_4f0 < 5; local_4f0 = local_4f0 + 1) {
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffe998,(int64_t)in_stack_ffffffffffffe990);
      dVar1 = *pdVar6;
      pdVar6 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffe998,(int64_t)in_stack_ffffffffffffe990);
      *pdVar6 = dVar1;
      for (local_4f4 = 0; local_4f4 < 3; local_4f4 = local_4f4 + 1) {
        pdVar6 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe998,(int64_t)in_stack_ffffffffffffe990);
        dVar1 = *pdVar6;
        pdVar6 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe998,(int64_t)in_stack_ffffffffffffe990);
        *pdVar6 = dVar1;
      }
    }
    pzshape::TPZShapePiram::ShapeGenerating
              (in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,in_stack_ffffffffffffed40);
    local_4f8 = 5;
    for (local_4fc = 5; local_4fc < 0x13; local_4fc = local_4fc + 1) {
      TPZVec<int>::operator[]((TPZVec<int> *)(local_10 + 0x70),(long)(local_4fc + -5));
      local_500 = pzshape::TPZShapePiram::NConnectShapeF
                            ((int)in_stack_ffffffffffffe980,
                             (int)((ulong)in_stack_ffffffffffffe978 >> 0x20));
      if (local_500 != 0) {
        pdVar6 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe998,(int64_t)in_stack_ffffffffffffe990);
        dVar1 = *pdVar6;
        pdVar6 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe998,(int64_t)in_stack_ffffffffffffe990);
        *pdVar6 = dVar1;
        for (local_504 = 0; local_504 < 3; local_504 = local_504 + 1) {
          pdVar6 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe998,(int64_t)in_stack_ffffffffffffe990)
          ;
          dVar1 = *pdVar6;
          pdVar6 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe998,(int64_t)in_stack_ffffffffffffe990)
          ;
          *pdVar6 = dVar1;
        }
        local_4f8 = local_4f8 + 1;
        if (local_500 != 1) {
          local_510 = TPZVec<TPZTransform<double>_>::operator[]
                                ((TPZVec<TPZTransform<double>_> *)(local_10 + 400),
                                 (long)(local_4fc + -5));
          local_514 = pztopology::TPZPyramid::SideDimension(0x18a34af);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffe9a0,(int64_t)in_stack_ffffffffffffe998,
                     (int64_t)in_stack_ffffffffffffe990);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffe9a0,(int64_t)in_stack_ffffffffffffe998,
                     (int64_t)in_stack_ffffffffffffe990);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffe9a0,(int64_t)in_stack_ffffffffffffe998,
                     (int64_t)in_stack_ffffffffffffe990);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffe9a0,(int64_t)in_stack_ffffffffffffe998,
                     (int64_t)in_stack_ffffffffffffe990);
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffe9a0,
                     (int64_t)in_stack_ffffffffffffe998);
          TPZTransform<double>::Apply
                    (in_stack_ffffffffffffe9b0,in_stack_ffffffffffffe9a8,
                     (TPZVec<double> *)in_stack_ffffffffffffe9a0);
          TPZVec<int>::operator[]((TPZVec<int> *)(local_10 + 0x70),(long)(local_4fc + -5));
          pzshape::TPZShapePiram::ShapeInternal
                    ((int)((ulong)in_stack_ffffffffffffe9a0 >> 0x20),in_stack_ffffffffffffe998,
                     (int)((ulong)in_stack_ffffffffffffe990 >> 0x20),in_stack_ffffffffffffe988,
                     in_stack_ffffffffffffe980);
          if (local_514 < 3) {
            local_1438 = 0x3ff0000000000000;
            local_1440 = 0;
            local_1444 = 1;
            TPZFNMatrix<1,_double>::TPZFNMatrix
                      (in_stack_ffffffffffffe9c0,(int64_t)in_stack_ffffffffffffe9b8,
                       (int64_t)in_stack_ffffffffffffe9b0,(double *)in_stack_ffffffffffffe9a8);
            pTVar7 = TPZTransform<double>::Mult(local_510);
            (*(pTVar7->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x27])(0x3ff0000000000000,0,pTVar7,local_c88,local_14e8,local_1040,1)
            ;
            for (local_14fc = 1; local_14fc < local_500; local_14fc = local_14fc + 1) {
              pdVar6 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe998,
                                  (int64_t)in_stack_ffffffffffffe990);
              dVar1 = *pdVar6;
              pdVar6 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe998,
                                  (int64_t)in_stack_ffffffffffffe990);
              dVar2 = *pdVar6;
              pdVar6 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe998,
                                  (int64_t)in_stack_ffffffffffffe990);
              *pdVar6 = dVar1 * dVar2;
              for (local_1500 = 0; local_1500 < 3; local_1500 = local_1500 + 1) {
                pdVar6 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffe998,
                                    (int64_t)in_stack_ffffffffffffe990);
                dVar1 = *pdVar6;
                pdVar6 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffe998,
                                    (int64_t)in_stack_ffffffffffffe990);
                dVar2 = *pdVar6;
                pdVar6 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffe998,
                                    (int64_t)in_stack_ffffffffffffe990);
                dVar3 = *pdVar6;
                pdVar6 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffe998,
                                    (int64_t)in_stack_ffffffffffffe990);
                dVar4 = *pdVar6;
                pdVar6 = TPZFMatrix<double>::operator()
                                   (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                                    (int64_t)in_stack_ffffffffffffe998,
                                    (int64_t)in_stack_ffffffffffffe990);
                *pdVar6 = dVar1 * dVar2 + dVar3 * dVar4;
              }
              local_4f8 = local_4f8 + 1;
            }
            TPZFNMatrix<1,_double>::~TPZFNMatrix((TPZFNMatrix<1,_double> *)0x18a39c1);
          }
          else {
            for (local_1504 = 1; local_1504 < local_500; local_1504 = local_1504 + 1) {
              pdVar6 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe998,
                                  (int64_t)in_stack_ffffffffffffe990);
              dVar1 = *pdVar6;
              pdVar6 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe998,
                                  (int64_t)in_stack_ffffffffffffe990);
              in_stack_ffffffffffffe9c0 = (TPZFNMatrix<1,_double> *)(dVar1 * *pdVar6);
              pdVar6 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe998,
                                  (int64_t)in_stack_ffffffffffffe990);
              *pdVar6 = (double)in_stack_ffffffffffffe9c0;
              for (local_1508 = 0; local_1508 < 3; local_1508 = local_1508 + 1) {
                in_stack_ffffffffffffe9b8 =
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe998,
                                (int64_t)in_stack_ffffffffffffe990);
                in_stack_ffffffffffffe9a8 = (TPZVec<double> *)*in_stack_ffffffffffffe9b8;
                in_stack_ffffffffffffe9b0 =
                     (TPZTransform<double> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe998,
                                (int64_t)in_stack_ffffffffffffe990);
                in_stack_ffffffffffffe998 =
                     (TPZVec<double> *)
                     (in_stack_ffffffffffffe9b0->super_TPZSavable)._vptr_TPZSavable;
                in_stack_ffffffffffffe9a0 =
                     (TPZFNMatrix<100,_double> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe998,
                                (int64_t)in_stack_ffffffffffffe990);
                in_stack_ffffffffffffe988 =
                     (TPZFMatrix<double> *)
                     (in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                     super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
                in_stack_ffffffffffffe990 =
                     TPZFMatrix<double>::operator()
                               ((TPZFMatrix<double> *)in_stack_ffffffffffffe9a0,
                                (int64_t)in_stack_ffffffffffffe998,
                                (int64_t)in_stack_ffffffffffffe990);
                in_stack_ffffffffffffe978 =
                     (_func_int **)
                     ((double)in_stack_ffffffffffffe9a8 * (double)in_stack_ffffffffffffe998 +
                     (double)in_stack_ffffffffffffe988 * *in_stack_ffffffffffffe990);
                in_stack_ffffffffffffe980 =
                     (TPZFMatrix<double> *)
                     TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe9a0->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe998,
                                (int64_t)in_stack_ffffffffffffe990);
                (in_stack_ffffffffffffe980->super_TPZMatrix<double>).super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable = in_stack_ffffffffffffe978;
              }
              local_4f8 = local_4f8 + 1;
            }
          }
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffe980);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18a3c13);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18a3c20);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18a3c2d);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18a3c3a);
        }
      }
    }
    TPZFNMatrix<57,_double>::~TPZFNMatrix((TPZFNMatrix<57,_double> *)0x18a3ca0);
    TPZFNMatrix<57,_double>::~TPZFNMatrix((TPZFNMatrix<57,_double> *)0x18a3cad);
  }
  return;
}

Assistant:

void TPZShapeH1<TSHAPE>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data) {

    
//    TPZVec<REAL> &pt = par.pt;
//    TPZFMatrix<REAL> &phi = par.phi;
//    TPZFMatrix<REAL> &dphi = par.dphi;
    
    TSHAPE::ShapeCorner(pt,data.fPhi,data.fDPhi);
    
    if(data.fPhi.Rows() == TSHAPE::NCornerNodes) return;
    
    const int dim = TSHAPE::Dimension;
    const int NSides = TSHAPE::NSides;
    const int NCorners = TSHAPE::NCornerNodes;

    TPZFNMatrix<NSides*dim,REAL> phiblend(NSides,1),dphiblend(dim,NSides);
    for(int nod=0; nod<NCorners; nod++)
    {
        phiblend(nod,0) = data.fPhi(nod,0);
        for(int d=0; d< dim; d++)
        {
            dphiblend(d,nod) = data.fDPhi(d,nod);
        }
    }
    TSHAPE::ShapeGenerating(pt, phiblend, dphiblend);
    int shape = NCorners;
    for (int side = NCorners; side<NSides ; side++)
    {
        int numshape = TSHAPE::NConnectShapeF(side, data.fH1ConnectOrders[side-NCorners]);
        if(numshape == 0) continue;
        
        data.fPhi(shape,0) = phiblend(side,0);
        for(int d=0; d<dim; d++) data.fDPhi(d,shape) = dphiblend(d,side);
        shape++;
        
        if(numshape == 1) continue;
        
        TPZTransform<REAL> &transform = data.fSideTransforms[side - NCorners];
        int sidedim = TSHAPE::SideDimension(side);
        TPZFNMatrix<100,REAL> phin(numshape,1), dphin(sidedim,numshape), dphiaux(TSHAPE::Dimension,numshape),
            dphiaux2(TSHAPE::Dimension,numshape);
        TPZManVector<REAL,3> outvec(sidedim);
        transform.Apply(pt, outvec);
//        dphin.Zero();
        TSHAPE::ShapeInternal(side, outvec,data.fH1ConnectOrders[side - NCorners], phin, dphin);
        if(sidedim < 3)
        {
            constexpr REAL alpha = 1.;
            constexpr REAL beta = 0.;
            constexpr int opt = 1;
            TPZFNMatrix<1,REAL> auxmat(1,1,0);    
            TPZFMatrix<REAL> &mult = transform.Mult();
            mult.MultAdd(dphin, auxmat, dphiaux,alpha,beta,opt);
            
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphiaux(xj,i);
                }
                shape++;
            }
        } else
        {
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphin(xj,i);
                }
                shape++;
            }

        }
    }
    
}